

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O1

WId __thiscall QWidget::effectiveWinId(QWidget *this)

{
  WId WVar1;
  
  WVar1 = this->data->winid;
  if ((WVar1 == 0) && ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0)) {
    WVar1 = 0;
    while (this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10), this != (QWidget *)0x0) {
      if (this->data->winid != 0) {
        return this->data->winid;
      }
    }
  }
  return WVar1;
}

Assistant:

inline WId internalWinId() const { return data->winid; }